

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::Topology::calculateHalfEdges(Topology *this)

{
  SubdivMesh *pSVar1;
  _func_int **pp_Var2;
  size_type __new_size;
  _func_int **pp_Var3;
  char cVar4;
  int iVar5;
  task *ptVar6;
  runtime_error *prVar7;
  size_t numHalfEdges;
  task_group_context context;
  Topology *local_e8;
  Topology *local_e0;
  _func_int ***local_d8;
  _func_int **local_d0;
  _func_int **local_c8;
  undefined4 local_c0;
  wait_context local_b8;
  task_group_context local_a8;
  
  pSVar1 = this->mesh;
  pp_Var2 = (_func_int **)(pSVar1->faceVertices).super_RawBufferView.num;
  __new_size = (((pSVar1->topology).items)->vertexIndices).super_RawBufferView.num;
  local_d0 = (_func_int **)pSVar1->numHalfEdges;
  std::vector<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>::
  resize(&this->halfEdges0,__new_size);
  std::vector<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>::
  resize(&this->halfEdges1,__new_size);
  local_a8.my_version = proxy_support;
  local_a8.my_traits = (context_traits)0x4;
  local_a8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_a8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_a8.my_name = CUSTOM_CTX;
  local_e8 = this;
  tbb::detail::r1::initialize(&local_a8);
  if (pp_Var2 != (_func_int **)0x0) {
    local_e0 = (Topology *)0x0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e0,0x80);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_02191868;
    ptVar6[1]._vptr_task = pp_Var2;
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 0x1000;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_e8;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar6[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar6[1].m_reserved + 0x24) = 5;
    ptVar6[1].m_reserved[3] = (long)iVar5 * 2 & 0x7ffffffffffffffe;
    ptVar6[1].m_reserved[5] = (uint64_t)local_e0;
    local_c8 = (_func_int **)0x0;
    local_c0 = 1;
    local_b8.m_version_and_traits = 1;
    local_b8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar6[1].m_reserved[2] = (uint64_t)&local_c8;
    tbb::detail::r1::execute_and_wait(ptVar6,&local_a8,&local_b8,&local_a8);
  }
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_a8);
  if (cVar4 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_a8);
  radix_sort<embree::SubdivMesh::KeyHalfEdge,unsigned_long>
            ((this->halfEdges1).
             super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->halfEdges0).
             super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_start,(size_t)local_d0,0x2000);
  pp_Var3 = local_d0;
  local_a8.my_version = proxy_support;
  local_a8.my_traits = (context_traits)0x4;
  local_a8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_a8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_a8.my_name = CUSTOM_CTX;
  local_e0 = this;
  local_d8 = &local_d0;
  tbb::detail::r1::initialize(&local_a8);
  if (pp_Var3 != (_func_int **)0x0) {
    local_e8 = (Topology *)0x0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e8,0x80);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_021918b0;
    ptVar6[1]._vptr_task = pp_Var3;
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 0x1000;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_e0;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar6[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar6[1].m_reserved + 0x24) = 5;
    ptVar6[1].m_reserved[3] = (long)iVar5 * 2 & 0x7ffffffffffffffe;
    ptVar6[1].m_reserved[5] = (uint64_t)local_e8;
    local_c8 = (_func_int **)0x0;
    local_c0 = 1;
    local_b8.m_version_and_traits = 1;
    local_b8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar6[1].m_reserved[2] = (uint64_t)&local_c8;
    tbb::detail::r1::execute_and_wait(ptVar6,&local_a8,&local_b8,&local_a8);
  }
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_a8);
  if (cVar4 == '\0') {
    tbb::detail::r1::destroy(&local_a8);
    local_a8.my_version = proxy_support;
    local_a8.my_traits = (context_traits)0x4;
    local_a8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_a8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_a8.my_name = CUSTOM_CTX;
    local_e8 = this;
    tbb::detail::r1::initialize(&local_a8);
    if (pp_Var2 != (_func_int **)0x0) {
      local_e0 = (Topology *)0x0;
      ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e0,0x80);
      ptVar6->m_reserved[3] = 0;
      ptVar6->m_reserved[4] = 0;
      ptVar6->m_reserved[1] = 0;
      ptVar6->m_reserved[2] = 0;
      (ptVar6->super_task_traits).m_version_and_traits = 0;
      ptVar6->m_reserved[0] = 0;
      ptVar6->m_reserved[5] = 0;
      ptVar6->_vptr_task = (_func_int **)&PTR__task_021918f8;
      ptVar6[1]._vptr_task = pp_Var2;
      ptVar6[1].super_task_traits.m_version_and_traits = 0;
      ptVar6[1].m_reserved[0] = 0x1000;
      ptVar6[1].m_reserved[1] = (uint64_t)&local_e8;
      iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)(ptVar6[1].m_reserved + 4) = 0;
      *(undefined1 *)((long)ptVar6[1].m_reserved + 0x24) = 5;
      ptVar6[1].m_reserved[3] = (long)iVar5 * 2 & 0x7ffffffffffffffe;
      ptVar6[1].m_reserved[5] = (uint64_t)local_e0;
      local_c8 = (_func_int **)0x0;
      local_c0 = 1;
      local_b8.m_version_and_traits = 1;
      local_b8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
      ;
      ptVar6[1].m_reserved[2] = (uint64_t)&local_c8;
      tbb::detail::r1::execute_and_wait(ptVar6,&local_a8,&local_b8,&local_a8);
    }
    cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_a8);
    if (cVar4 == '\0') {
      tbb::detail::r1::destroy(&local_a8);
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"task cancelled");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SubdivMesh::Topology::calculateHalfEdges()
  {
    const size_t blockSize = 4096;
    const size_t numEdges = mesh->numEdges();
    const size_t numFaces = mesh->numFaces();
    const size_t numHalfEdges = mesh->numHalfEdges;

    /* allocate temporary array */
    halfEdges0.resize(numEdges);
    halfEdges1.resize(numEdges);

    /* create all half edges */
    parallel_for( size_t(0), numFaces, blockSize, [&](const range<size_t>& r) 
    {
      for (size_t f=r.begin(); f<r.end(); f++) 
      {
	const unsigned N = mesh->faceVertices[f];
	const unsigned e = mesh->faceStartEdge[f];

	for (unsigned de=0; de<N; de++)
	{
	  HalfEdge* edge = &halfEdges[e+de];
          int nextOfs = (de == (N-1)) ? -int(N-1) : +1;
          int prevOfs = (de ==     0) ? +int(N-1) : -1;
	  
	  const unsigned int startVertex = vertexIndices[e+de];
          const unsigned int endVertex = vertexIndices[e+de+nextOfs]; 
	  const uint64_t key = SubdivMesh::Edge(startVertex,endVertex);

          /* we always have to use the geometry topology to lookup creases */
          const unsigned int startVertex0 = mesh->topology[0].vertexIndices[e+de];
          const unsigned int endVertex0 = mesh->topology[0].vertexIndices[e+de+nextOfs]; 
	  const uint64_t key0 = SubdivMesh::Edge(startVertex0,endVertex0);
	  
	  edge->vtx_index              = startVertex;
	  edge->next_half_edge_ofs     = nextOfs;
	  edge->prev_half_edge_ofs     = prevOfs;
	  edge->opposite_half_edge_ofs = 0;
	  edge->edge_crease_weight     = mesh->edgeCreaseMap->edgeCreaseMap.lookup(key0,0.0f);
	  edge->vertex_crease_weight   = mesh->vertexCreaseMap->vertexCreaseMap.lookup(startVertex0,0.0f);
	  edge->edge_level             = mesh->getEdgeLevel(e+de);
          edge->patch_type             = HalfEdge::COMPLEX_PATCH; // type gets updated below
          edge->vertex_type            = HalfEdge::REGULAR_VERTEX;

          if (unlikely(mesh->holeSet->holeSet.lookup(unsigned(f)))) 
	    halfEdges1[e+de] = SubdivMesh::KeyHalfEdge(std::numeric_limits<uint64_t>::max(),edge);
	  else
	    halfEdges1[e+de] = SubdivMesh::KeyHalfEdge(key,edge);
	}
      }
    });

    /* sort half edges to find adjacent edges */
    radix_sort_u64(halfEdges1.data(),halfEdges0.data(),numHalfEdges);

    /* link all adjacent pairs of edges */
    parallel_for( size_t(0), numHalfEdges, blockSize, [&](const range<size_t>& r) 
    {
      /* skip if start of adjacent edges was not in our range */
      size_t e=r.begin();
      if (e != 0 && (halfEdges1[e].key == halfEdges1[e-1].key)) {
	const uint64_t key = halfEdges1[e].key;
	while (e<r.end() && halfEdges1[e].key == key) e++;
      }

      /* process all adjacent edges starting in our range */
      while (e<r.end())
      {
	const uint64_t key = halfEdges1[e].key;
	if (key == std::numeric_limits<uint64_t>::max()) break;
	size_t N=1; while (e+N<numHalfEdges && halfEdges1[e+N].key == key) N++;

        /* border edges are identified by not having an opposite edge set */
	if (N == 1) {
          halfEdges1[e].edge->edge_crease_weight = float(inf);
	}

        /* standard edge shared between two faces */
        else if (N == 2)
        {
          /* create edge crease if winding order mismatches between neighboring patches */
          if (halfEdges1[e+0].edge->next()->vtx_index != halfEdges1[e+1].edge->vtx_index)
          {
            halfEdges1[e+0].edge->edge_crease_weight = float(inf);
            halfEdges1[e+1].edge->edge_crease_weight = float(inf);
          }
          /* otherwise mark edges as opposites of each other */
          else {
            halfEdges1[e+0].edge->setOpposite(halfEdges1[e+1].edge);
            halfEdges1[e+1].edge->setOpposite(halfEdges1[e+0].edge);
          }
	}

        /* non-manifold geometry is handled by keeping vertices fixed during subdivision */
        else {
	  for (size_t i=0; i<N; i++) {
	    halfEdges1[e+i].edge->vertex_crease_weight = inf;
            halfEdges1[e+i].edge->vertex_type = HalfEdge::NON_MANIFOLD_EDGE_VERTEX;
            halfEdges1[e+i].edge->edge_crease_weight = inf;

	    halfEdges1[e+i].edge->next()->vertex_crease_weight = inf;
            halfEdges1[e+i].edge->next()->vertex_type = HalfEdge::NON_MANIFOLD_EDGE_VERTEX;
            halfEdges1[e+i].edge->next()->edge_crease_weight = inf;
	  }
	}
	e+=N;
      }
    });

    /* set subdivision mode and calculate patch types */
    parallel_for( size_t(0), numFaces, blockSize, [&](const range<size_t>& r) 
    {
      for (size_t f=r.begin(); f<r.end(); f++) 
      {
        HalfEdge* edge = &halfEdges[mesh->faceStartEdge[f]];

        /* for vertex topology we also test if vertices are valid */
        if (this == &mesh->topology[0])
        {
          /* calculate if face is valid */
          for (size_t t=0; t<mesh->numTimeSteps; t++)
            mesh->invalidFace(f,t) = !edge->valid(mesh->vertices[t]) || mesh->holeSet->holeSet.lookup(unsigned(f));
        }

        /* pin some edges and vertices */
        for (size_t i=0; i<mesh->faceVertices[f]; i++) 
        {
          /* pin corner vertices when requested by user */
          if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_CORNERS && edge[i].isCorner())
            edge[i].vertex_crease_weight = float(inf);
          
          /* pin all border vertices when requested by user */
          else if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_BOUNDARY && edge[i].vertexHasBorder()) 
            edge[i].vertex_crease_weight = float(inf);

          /* pin all edges and vertices when requested by user */
          else if (subdiv_mode == RTC_SUBDIVISION_MODE_PIN_ALL) {
            edge[i].edge_crease_weight = float(inf);
            edge[i].vertex_crease_weight = float(inf);
          }
        }

        /* we have to calculate patch_type last! */
        HalfEdge::PatchType patch_type = edge->patchType();
        for (size_t i=0; i<mesh->faceVertices[f]; i++) 
          edge[i].patch_type = patch_type;
      }
    });
  }